

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tutorial.cpp
# Opt level: O2

void __thiscall embree::TutorialApplication::initRayStats(TutorialApplication *this)

{
  int iVar1;
  long lVar2;
  size_t i;
  ulong uVar3;
  
  if (g_stats == (RayStats *)0x0) {
    iVar1 = tbb::detail::d1::max_concurrency();
    g_stats = (RayStats *)alignedMalloc((long)iVar1 << 7,0x40);
  }
  lVar2 = 0;
  uVar3 = 0;
  while( true ) {
    iVar1 = tbb::detail::d1::max_concurrency();
    if ((ulong)(long)iVar1 <= uVar3) break;
    *(undefined4 *)((long)g_stats->pad + lVar2 + -4) = 0;
    uVar3 = uVar3 + 1;
    lVar2 = lVar2 + 0x80;
  }
  return;
}

Assistant:

void TutorialApplication::initRayStats()
  {
    if (!g_stats)
      g_stats = (RayStats*)alignedMalloc(TaskScheduler::threadCount() * sizeof(RayStats), 64);

    for (size_t i = 0; i < TaskScheduler::threadCount(); i++)
      g_stats[i].numRays = 0;
  }